

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

qreal __thiscall QSimplex::solver(QSimplex *this,SolverFactor factor)

{
  long lVar1;
  bool bVar2;
  underlying_type_t<QSimplex::SolverFactor> uVar3;
  QSimplexVariable **ppQVar4;
  double *pdVar5;
  SolverFactor in_ESI;
  QSimplex *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  qreal qVar7;
  qreal resultOffset;
  const_iterator iter;
  QSimplex *in_stack_ffffffffffffff90;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int columnIndex;
  QSimplex *in_stack_ffffffffffffffb0;
  double local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  clearRow(in_RDI,0);
  local_40 = 0.0;
  QHash<QSimplexVariable_*,_double>::cbegin
            ((QHash<QSimplexVariable_*,_double> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    QHash<QSimplexVariable_*,_double>::cend
              ((QHash<QSimplexVariable_*,_double> *)in_stack_ffffffffffffff98);
    bVar2 = QHash<QSimplexVariable_*,_double>::const_iterator::operator!=
                      (in_stack_ffffffffffffff98,(const_iterator *)in_stack_ffffffffffffff90);
    if (!bVar2) break;
    ppQVar4 = QHash<QSimplexVariable_*,_double>::const_iterator::key((const_iterator *)0xa5d883);
    if ((*ppQVar4)->index == -1) {
      pdVar5 = QHash<QSimplexVariable_*,_double>::const_iterator::value((const_iterator *)0xa5d896);
      in_stack_ffffffffffffffb0 = (QSimplex *)*pdVar5;
      ppQVar4 = QHash<QSimplexVariable_*,_double>::const_iterator::key((const_iterator *)0xa5d8aa);
      local_40 = (double)in_stack_ffffffffffffffb0 * (*ppQVar4)->result + local_40;
    }
    else {
      ppQVar4 = QHash<QSimplexVariable_*,_double>::const_iterator::key((const_iterator *)0xa5d8d7);
      columnIndex = (*ppQVar4)->index;
      in_stack_ffffffffffffffa0 = (const_iterator *)(double)-in_ESI;
      pdVar5 = QHash<QSimplexVariable_*,_double>::const_iterator::value((const_iterator *)0xa5d8fd);
      setValueAt(in_RDI,0,columnIndex,(double)in_stack_ffffffffffffffa0 * *pdVar5);
    }
    QHash<QSimplexVariable_*,_double>::const_iterator::operator++(in_stack_ffffffffffffffa0);
  }
  solveMaxHelper(in_stack_ffffffffffffff90);
  collectResults(in_stack_ffffffffffffffb0);
  uVar3 = qToUnderlying<QSimplex::SolverFactor>(in_ESI);
  dVar6 = (double)uVar3;
  qVar7 = valueAt(in_RDI,0,in_RDI->columns + -1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return dVar6 * qVar7 + local_40;
  }
  __stack_chk_fail();
}

Assistant:

qreal QSimplex::solver(SolverFactor factor)
{
    // Remove old objective
    clearRow(0);

    // Set new objective in the first row of the simplex matrix
    qreal resultOffset = 0;
    for (auto iter = objective->variables.cbegin(); iter != objective->variables.cend(); ++iter) {

        // Check if the variable was removed in the simplification process.
        // If so, we save its offset to the objective function and skip adding
        // it to the matrix.
        if (iter.key()->index == -1) {
            resultOffset += iter.value() * iter.key()->result;
            continue;
        }

        setValueAt(0, iter.key()->index, -1 * factor * iter.value());
    }

    solveMaxHelper();
    collectResults();

#ifdef QT_DEBUG
    for (int i = 0; i < constraints.size(); ++i) {
        Q_ASSERT(constraints[i]->isSatisfied());
    }
#endif

    // Return the value calculated by the simplex plus the value of the
    // fixed variables.
    return (qToUnderlying(factor) * valueAt(0, columns - 1)) + resultOffset;
}